

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_longname(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  wchar_t local_3c;
  wchar_t err;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  a_local._4_4_ = read_body_to_string(a,tar,&tar->longname,h,unconsumed);
  if ((a_local._4_4_ == L'\0') &&
     ((local_3c = tar_read_header(a,tar,entry,unconsumed), local_3c == L'\0' ||
      (a_local._4_4_ = local_3c, local_3c == L'\xffffffec')))) {
    wVar1 = _archive_entry_copy_pathname_l
                      (entry,(tar->longname).s,(tar->longname).length,tar->sconv);
    if (wVar1 != L'\0') {
      local_3c = set_conversion_failed_error(a,tar->sconv,"Pathname");
    }
    a_local._4_4_ = local_3c;
  }
  return a_local._4_4_;
}

Assistant:

static int
header_longname(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err;

	err = read_body_to_string(a, tar, &(tar->longname), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);
	/* Read and parse "real" header, then override name. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);
	if (archive_entry_copy_pathname_l(entry, tar->longname.s,
	    archive_strlen(&(tar->longname)), tar->sconv) != 0)
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
	return (err);
}